

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

string * __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::AsString_abi_cxx11_
          (string *__return_storage_ptr__,SymbolEntry *this,DescriptorIndex *index)

{
  pointer pEVar1;
  AlphaNum local_68;
  AlphaNum local_38;
  
  pEVar1 = (index->all_values_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38.piece_._M_str = pEVar1[this->data_offset].encoded_package._M_dataplus._M_p;
  local_38.piece_._M_len = pEVar1[this->data_offset].encoded_package._M_string_length;
  local_68.piece_._M_len = (size_t)(local_38.piece_._M_len != 0);
  local_68.piece_._M_str = "";
  if (local_38.piece_._M_len != 0) {
    local_68.piece_._M_str = ".";
  }
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_38,&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string AsString(const DescriptorIndex& index) const {
      auto p = package(index);
      return absl::StrCat(p, p.empty() ? "" : ".", symbol(index));
    }